

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

string * __thiscall
soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,EndpointDeclaration *e)

{
  long *plVar1;
  long *plVar2;
  string *psVar3;
  char *in_RCX;
  ArrayWithPreallocation<soul::Identifier,_8UL> *other;
  string_view name;
  IdentifierPath parentPath;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_180;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_128;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_d0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_78;
  
  plVar2 = *(long **)(this + 0x20);
  if (plVar2 == (long *)0x0) {
    psVar3 = Identifier::toString_abi_cxx11_((Identifier *)(this + 0x30));
    std::__cxx11::string::string((string *)&local_1e0,(string *)psVar3);
  }
  else {
    local_128.items = (Identifier *)local_128.space;
    local_128.numActive = 0;
    local_128.numAllocated = 8;
    plVar1 = (long *)(**(code **)(*plVar2 + 0x40))(plVar2);
    if (plVar1 == (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))(&local_180,plVar2);
      other = &local_180;
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_128,other);
    }
    else {
      plVar2 = (long *)(**(code **)(*plVar1 + 0x18))(plVar1);
      in_RCX = (char *)*plVar2;
      (**(code **)(in_RCX + 0x10))(&local_78,plVar2);
      IdentifierPath::IdentifierPath
                ((IdentifierPath *)&local_180,(IdentifierPath *)&local_78,(string *)plVar1[7]);
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_128,&local_180);
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_180);
      other = &local_78;
    }
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(other);
    ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&local_d0,&local_128);
    IdentifierPath::IdentifierPath
              ((IdentifierPath *)&local_180,(IdentifierPath *)&local_d0,*(string **)(this + 0x30));
    IdentifierPath::toString_abi_cxx11_(&local_1a0,(IdentifierPath *)&local_180);
    Program::stripRootNamespaceFromQualifiedPath(&local_1e0,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_180);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_d0);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(&local_128);
  }
  std::operator+(&local_1c0,"endpoint_",&local_1e0);
  name._M_str = in_RCX;
  name._M_len = (size_t)local_1c0._M_dataplus._M_p;
  makeUID_abi_cxx11_(__return_storage_ptr__,(soul *)local_1c0._M_string_length,name);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

static std::string makeUID (AST::EndpointDeclaration& e)    { return makeUID ("endpoint_" + getFullPathForASTObject (e)); }